

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
fmt::v5::format<char[9],double,int>(char (*format_str) [9],double *args,int *args_1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  in_stack_00000200;
  basic_string_view<char> in_stack_00000210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  char (*in_stack_ffffffffffffff98) [9];
  checked_args<char[9],_double,_int> *in_stack_ffffffffffffffa0;
  
  args_00 = in_RDI;
  to_string_view<char>((char *)0x195bee);
  internal::checked_args<char[9],_double,_int>::checked_args
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(double *)args_00,(int *)in_RDI);
  internal::checked_args<char[9],_double,_int>::operator*
            ((checked_args<char[9],_double,_int> *)0x195c1b);
  internal::vformat<char>(in_stack_00000210,in_stack_00000200);
  return args_00;
}

Assistant:

inline std::basic_string<FMT_CHAR(S)> format(
    const S &format_str, const Args &... args) {
  return internal::vformat(
    to_string_view(format_str),
    *internal::checked_args<S, Args...>(format_str, args...));
}